

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O3

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
finishedWithValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  const_iterator __position;
  _Rb_tree_header *p_Var3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar1 == 0) {
    p_Var2 = (_Base_ptr)
             (this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      p_Var3 = &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
      __position._M_node = (_Base_ptr)p_Var3;
      do {
        if (index <= (int)p_Var2[1]._M_color) {
          __position._M_node = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < index];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position._M_node != p_Var3) &&
         ((int)__position._M_node[1]._M_color <= index)) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_M_erase_aux(&(this->usedPromiseByInteger)._M_t,__position);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void finishedWithValue(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        if (fnd != usedPromiseByInteger.end()) {
            usedPromiseByInteger.erase(fnd);
        }
    }